

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_not(runtime_type *this,var *b)

{
  bool bVar1;
  type_info *this_00;
  bool *pbVar2;
  runtime_error *this_01;
  any *in_RDX;
  allocator local_31;
  string local_30;
  
  this_00 = cs_impl::any::type(in_RDX);
  bVar1 = std::type_info::operator==(this_00,(type_info *)&bool::typeinfo);
  if (bVar1) {
    pbVar2 = cs_impl::any::const_val<bool>(in_RDX);
    local_30._M_dataplus._M_p._0_1_ = *pbVar2 ^ 1;
    cs_impl::any::any<bool>((any *)this,(bool *)&local_30);
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_30,"Unsupported operator operations(Not).",&local_31);
  runtime_error::runtime_error(this_01,&local_30);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_not(const var &b)
	{
		if (b.type() == typeid(boolean))
			return boolean(!b.const_val<boolean>());
		else
			throw runtime_error("Unsupported operator operations(Not).");
	}